

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastF64S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  undefined8 *puVar2;
  char *pcVar3;
  ushort *puVar4;
  uint *puVar5;
  
  if (data.field_0._0_2_ != 0) {
    pcVar3 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  puVar2 = (undefined8 *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar2 & 7) != 0) {
    AlignFail(puVar2);
  }
  *puVar2 = *(undefined8 *)(ptr + 2);
  puVar4 = (ushort *)(ptr + 10);
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar4) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar5 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar5 & 3) != 0) {
        AlignFail();
      }
      *puVar5 = *puVar5 | (uint)hasbits | (uint)(1L << ((ulong)data.field_0 >> 0x10 & 0x3f));
    }
    return (char *)puVar4;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar4;
  if ((uVar1 & 7) == 0) {
    pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
    return pcVar3;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastF64S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularFixed<uint64_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}